

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

int xercesc_4_0::XMLString::lastIndexOf
              (XMLCh *toSearch,XMLCh ch,XMLSize_t fromIndex,MemoryManager *manager)

{
  ulong uVar1;
  XMLSize_t XVar2;
  ArrayIndexOutOfBoundsException *this;
  ulong uVar3;
  
  XVar2 = stringLen(toSearch);
  if (XVar2 <= fromIndex) {
    this = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0x553,Str_StartIndexPastEnd,manager);
    __cxa_throw(this,&ArrayIndexOutOfBoundsException::typeinfo,XMLException::~XMLException);
  }
  uVar1 = fromIndex * 2;
  do {
    uVar3 = uVar1;
    if ((XMLCh *)((long)toSearch + uVar3) < toSearch) {
      return -1;
    }
    uVar1 = uVar3 - 2;
  } while (*(XMLCh *)((long)toSearch + uVar3) != ch);
  return (int)(uVar3 >> 1);
}

Assistant:

int XMLString::lastIndexOf( const   XMLCh* const    toSearch
                            , const XMLCh           ch
                            , const XMLSize_t       fromIndex
                            , MemoryManager* const  manager)
{
    const XMLSize_t len = stringLen(toSearch);
    if (fromIndex >= len) {
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Str_StartIndexPastEnd, manager);
    }

    const XMLCh* srcPtr = toSearch+fromIndex;
    while (srcPtr >= toSearch)
        if (ch == *srcPtr--)
            return (int)(srcPtr + 1 - toSearch);
    return -1;
}